

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

Slice __thiscall jbcoin::SerialIter::getSlice(SerialIter *this,size_t bytes)

{
  uint8_t *puVar1;
  Slice SVar2;
  
  if (bytes <= this->remain_) {
    puVar1 = this->p_;
    this->p_ = puVar1 + bytes;
    this->used_ = this->used_ + bytes;
    this->remain_ = this->remain_ - bytes;
    SVar2.size_ = bytes;
    SVar2.data_ = puVar1;
    return SVar2;
  }
  Throw<std::runtime_error,char_const(&)[28]>((char (*) [28])"invalid SerialIter getSlice");
}

Assistant:

Slice
SerialIter::getSlice (std::size_t bytes)
{
    if (bytes > remain_)
        Throw<std::runtime_error> (
            "invalid SerialIter getSlice");
    Slice s(p_, bytes);
    p_ += bytes;
    used_ += bytes;
    remain_ -= bytes;
    return s;
}